

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FieldDescriptor *field,bool immutable,
          ClassNameResolver *name_resolver,Options *options)

{
  float fVar1;
  double dVar2;
  Options *this_00;
  bool bVar3;
  CppType CVar4;
  int32_t x;
  uint32_t x_00;
  Type TVar5;
  int64_t x_01;
  uint64_t x_02;
  char *__s;
  DescriptorStringView psVar6;
  EnumDescriptor *descriptor;
  EnumValueDescriptor *this_01;
  Descriptor *descriptor_00;
  LogMessage *pLVar7;
  undefined7 in_register_00000009;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  float fVar8;
  float fVar9;
  double dVar10;
  double dVar11;
  string_view text;
  string_view format;
  string_view format_00;
  LogMessageFatal local_570 [23];
  Voidify local_559;
  AlphaNum local_558;
  string local_528;
  AlphaNum local_508;
  AlphaNum local_4d8;
  AlphaNum local_4a8;
  string local_478;
  AlphaNum local_458;
  undefined1 local_428 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  Arg local_3f8;
  basic_string_view<char,_std::char_traits<char>_> local_3c8;
  AlphaNum local_3b8;
  undefined1 local_388 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  AlphaNum local_358;
  AlphaNum local_328;
  undefined1 local_2f8 [16];
  allocator<char> local_2e1;
  undefined1 local_2e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  Arg local_2b0;
  basic_string_view<char,_std::char_traits<char>_> local_280;
  allocator<char> local_269;
  AlphaNum local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  AlphaNum local_218;
  allocator<char> local_1e7;
  allocator<char> local_1e6;
  allocator<char> local_1e5;
  float local_1e4;
  undefined1 local_1e0 [4];
  float value_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  AlphaNum local_190;
  allocator<char> local_15b;
  allocator<char> local_15a;
  allocator<char> local_159;
  double local_158;
  double value;
  AlphaNum local_140;
  string local_110;
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  ClassNameResolver *local_30;
  Options *options_local;
  ClassNameResolver *name_resolver_local;
  java *pjStack_18;
  bool immutable_local;
  FieldDescriptor *field_local;
  
  options_local = (Options *)CONCAT71(in_register_00000009,immutable);
  name_resolver_local._7_1_ = (byte)field & 1;
  local_30 = name_resolver;
  pjStack_18 = this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
  this_00 = options_local;
  switch(CVar4) {
  case CPPTYPE_INT32:
    x = FieldDescriptor::default_value_int32((FieldDescriptor *)pjStack_18);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_60,x);
    absl::lts_20240722::StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20240722 *)&local_60,a);
    break;
  case CPPTYPE_INT64:
    x_01 = FieldDescriptor::default_value_int64((FieldDescriptor *)pjStack_18);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_c0,x_01);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_f0,"L");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_c0);
    break;
  case CPPTYPE_UINT32:
    x_00 = FieldDescriptor::default_value_uint32((FieldDescriptor *)pjStack_18);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_90,x_00);
    absl::lts_20240722::StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20240722 *)&local_90,a_00);
    break;
  case CPPTYPE_UINT64:
    x_02 = FieldDescriptor::default_value_uint64((FieldDescriptor *)pjStack_18);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_140,x_02);
    absl::lts_20240722::StrCat_abi_cxx11_(&local_110,(lts_20240722 *)&local_140,a_01);
    std::operator+(__return_storage_ptr__,&local_110,"L");
    std::__cxx11::string::~string((string *)&local_110);
    break;
  case CPPTYPE_DOUBLE:
    dVar10 = FieldDescriptor::default_value_double((FieldDescriptor *)pjStack_18);
    local_158 = dVar10;
    dVar11 = std::numeric_limits<double>::infinity();
    dVar2 = local_158;
    if ((dVar10 != dVar11) || (NAN(dVar10) || NAN(dVar11))) {
      dVar10 = std::numeric_limits<double>::infinity();
      if ((dVar2 != -dVar10) || (NAN(dVar2) || NAN(-dVar10))) {
        if (NAN(local_158)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"Double.NaN",&local_15b);
          std::allocator<char>::~allocator(&local_15b);
        }
        else {
          google::protobuf::io::SimpleDtoa_abi_cxx11_(local_158);
          absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_190,&local_1b0);
          absl::lts_20240722::AlphaNum::AlphaNum((AlphaNum *)local_1e0,"D");
          absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_190);
          std::__cxx11::string::~string((string *)&local_1b0);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"Double.NEGATIVE_INFINITY",&local_15a);
        std::allocator<char>::~allocator(&local_15a);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"Double.POSITIVE_INFINITY",&local_159);
      std::allocator<char>::~allocator(&local_159);
    }
    break;
  case CPPTYPE_FLOAT:
    fVar8 = FieldDescriptor::default_value_float((FieldDescriptor *)pjStack_18);
    local_1e4 = fVar8;
    fVar9 = std::numeric_limits<float>::infinity();
    fVar1 = local_1e4;
    if ((fVar8 != fVar9) || (NAN(fVar8) || NAN(fVar9))) {
      fVar8 = std::numeric_limits<float>::infinity();
      if ((fVar1 != -fVar8) || (NAN(fVar1) || NAN(-fVar8))) {
        if (NAN(local_1e4)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"Float.NaN",&local_1e7);
          std::allocator<char>::~allocator(&local_1e7);
        }
        else {
          google::protobuf::io::SimpleFtoa_abi_cxx11_(local_1e4);
          absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_218,&local_238);
          absl::lts_20240722::AlphaNum::AlphaNum(&local_268,"F");
          absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_218);
          std::__cxx11::string::~string((string *)&local_238);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"Float.NEGATIVE_INFINITY",&local_1e6);
        std::allocator<char>::~allocator(&local_1e6);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"Float.POSITIVE_INFINITY",&local_1e5);
      std::allocator<char>::~allocator(&local_1e5);
    }
    break;
  case CPPTYPE_BOOL:
    bVar3 = FieldDescriptor::default_value_bool((FieldDescriptor *)pjStack_18);
    __s = "false";
    if (bVar3) {
      __s = "true";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_269);
    std::allocator<char>::~allocator(&local_269);
    break;
  case CPPTYPE_ENUM:
    descriptor = (EnumDescriptor *)google::protobuf::FieldDescriptor::enum_type();
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_478,(ClassNameResolver *)this_00,descriptor,
               (bool)(name_resolver_local._7_1_ & 1));
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_458,&local_478);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_4a8,".");
    this_01 = (EnumValueDescriptor *)google::protobuf::FieldDescriptor::default_value_enum();
    psVar6 = EnumValueDescriptor::name_abi_cxx11_(this_01);
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_4d8,psVar6);
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_458,&local_4a8);
    std::__cxx11::string::~string((string *)&local_478);
    break;
  case CPPTYPE_STRING:
    TVar5 = GetType((FieldDescriptor *)pjStack_18);
    if (TVar5 == TYPE_BYTES) {
      bVar3 = FieldDescriptor::has_default_value((FieldDescriptor *)pjStack_18);
      if (bVar3) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_280,"com.google.protobuf.Internal.bytesDefaultValue(\"$0\")");
        psVar6 = FieldDescriptor::default_value_string_abi_cxx11_((FieldDescriptor *)pjStack_18);
        local_2e0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
        absl::lts_20240722::CEscape_abi_cxx11_(&local_2d0,local_2e0._0_8_,local_2e0._8_8_);
        absl::lts_20240722::substitute_internal::Arg::Arg<std::allocator<char>>
                  (&local_2b0,&local_2d0);
        format._M_str = (char *)&local_2b0;
        format._M_len = (size_t)local_280._M_str;
        absl::lts_20240722::Substitute_abi_cxx11_
                  (__return_storage_ptr__,(lts_20240722 *)local_280._M_len,format,
                   (Arg *)name_resolver);
        std::__cxx11::string::~string((string *)&local_2d0);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"com.google.protobuf.ByteString.EMPTY",
                   &local_2e1);
        std::allocator<char>::~allocator(&local_2e1);
      }
    }
    else {
      psVar6 = FieldDescriptor::default_value_string_abi_cxx11_((FieldDescriptor *)pjStack_18);
      local_2f8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
      text._M_str = local_2f8._8_8_;
      text._M_len = (size_t)text._M_str;
      bVar3 = AllAscii(local_2f8._0_8_,text);
      if (bVar3) {
        absl::lts_20240722::AlphaNum::AlphaNum(&local_328,"\"");
        psVar6 = FieldDescriptor::default_value_string_abi_cxx11_((FieldDescriptor *)pjStack_18);
        local_388 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
        absl::lts_20240722::CEscape_abi_cxx11_(&local_378,local_388._0_8_,local_388._8_8_);
        absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_358,&local_378);
        absl::lts_20240722::AlphaNum::AlphaNum(&local_3b8,"\"");
        absl::lts_20240722::StrCat_abi_cxx11_
                  ((AlphaNum *)__return_storage_ptr__,&local_328,&local_358);
        std::__cxx11::string::~string((string *)&local_378);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_3c8,"com.google.protobuf.Internal.stringDefaultValue(\"$0\")");
        psVar6 = FieldDescriptor::default_value_string_abi_cxx11_((FieldDescriptor *)pjStack_18);
        local_428 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
        absl::lts_20240722::CEscape_abi_cxx11_(&local_418,local_428._0_8_,local_428._8_8_);
        absl::lts_20240722::substitute_internal::Arg::Arg<std::allocator<char>>
                  (&local_3f8,&local_418);
        format_00._M_str = (char *)&local_3f8;
        format_00._M_len = (size_t)local_3c8._M_str;
        absl::lts_20240722::Substitute_abi_cxx11_
                  (__return_storage_ptr__,(lts_20240722 *)local_3c8._M_len,format_00,
                   (Arg *)name_resolver);
        std::__cxx11::string::~string((string *)&local_418);
      }
    }
    break;
  case CPPTYPE_MESSAGE:
    descriptor_00 = (Descriptor *)google::protobuf::FieldDescriptor::message_type();
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_528,(ClassNameResolver *)this_00,descriptor_00,
               (bool)(name_resolver_local._7_1_ & 1));
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_508,&local_528);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_558,".getDefaultInstance()");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_508);
    std::__cxx11::string::~string((string *)&local_528);
    break;
  default:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_570,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/java/helpers.cc"
               ,0x215);
    pLVar7 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_570);
    pLVar7 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar7,(char (*) [16])"Can\'t get here.");
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_559,pLVar7);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_570);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValue(const FieldDescriptor* field, bool immutable,
                         ClassNameResolver* name_resolver, Options options) {
  // Switch on CppType since we need to know which default_value_* method
  // of FieldDescriptor to call.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return absl::StrCat(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      // Need to print as a signed int since Java has no unsigned.
      return absl::StrCat(static_cast<int32_t>(field->default_value_uint32()));
    case FieldDescriptor::CPPTYPE_INT64:
      return absl::StrCat(field->default_value_int64(), "L");
    case FieldDescriptor::CPPTYPE_UINT64:
      return absl::StrCat(static_cast<int64_t>(field->default_value_uint64())) +
             "L";
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field->default_value_double();
      if (value == std::numeric_limits<double>::infinity()) {
        return "Double.POSITIVE_INFINITY";
      } else if (value == -std::numeric_limits<double>::infinity()) {
        return "Double.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Double.NaN";
      } else {
        return absl::StrCat(io::SimpleDtoa(value), "D");
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value = field->default_value_float();
      if (value == std::numeric_limits<float>::infinity()) {
        return "Float.POSITIVE_INFINITY";
      } else if (value == -std::numeric_limits<float>::infinity()) {
        return "Float.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Float.NaN";
      } else {
        return absl::StrCat(io::SimpleFtoa(value), "F");
      }
    }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_STRING:
      if (GetType(field) == FieldDescriptor::TYPE_BYTES) {
        if (field->has_default_value()) {
          // See comments in Internal.java for gory details.
          return absl::Substitute(
              "com.google.protobuf.Internal.bytesDefaultValue(\"$0\")",
              absl::CEscape(field->default_value_string()));
        } else {
          return "com.google.protobuf.ByteString.EMPTY";
        }
      } else {
        if (AllAscii(field->default_value_string())) {
          // All chars are ASCII.  In this case CEscape() works fine.
          return absl::StrCat(
              "\"", absl::CEscape(field->default_value_string()), "\"");
        } else {
          // See comments in Internal.java for gory details.
          return absl::Substitute(
              "com.google.protobuf.Internal.stringDefaultValue(\"$0\")",
              absl::CEscape(field->default_value_string()));
        }
      }

    case FieldDescriptor::CPPTYPE_ENUM:
      return absl::StrCat(
          name_resolver->GetClassName(field->enum_type(), immutable), ".",
          field->default_value_enum()->name());

    case FieldDescriptor::CPPTYPE_MESSAGE:
      return absl::StrCat(
          name_resolver->GetClassName(field->message_type(), immutable),
          ".getDefaultInstance()");

      // No default because we want the compiler to complain if any new
      // types are added.
  }

  ABSL_LOG(FATAL) << "Can't get here.";
  return "";
}